

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O1

void __thiscall
cmCTestBuildHandler::ProcessBuffer
          (cmCTestBuildHandler *this,char *data,int length,size_t *tick,size_t tick_len,ostream *ofs
          ,t_BuildProcessingQueueType *queue)

{
  iterator *piVar1;
  pointer *ppcVar2;
  char cVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  _Map_pointer ppbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  pointer pcVar9;
  iterator __position;
  pointer pcVar10;
  pointer pcVar11;
  pointer pcVar12;
  cmCTest *pcVar13;
  size_t sVar14;
  vector<char,std::allocator<char>> *this_00;
  int iVar15;
  size_t sVar16;
  _Map_pointer ppbVar17;
  ulong uVar18;
  ostream *poVar19;
  char *pcVar20;
  char *pcVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar22;
  _Elt_pointer pbVar23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar24;
  ulong uVar25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar26;
  long lVar27;
  _Elt_pointer pbVar28;
  bool bVar29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  cmCTestBuildErrorWarning errorwarning;
  undefined1 local_258 [24];
  _Map_pointer local_240;
  deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_238;
  ulong *local_230;
  char *local_228;
  int local_21c;
  ostream *local_218;
  long local_210;
  char *local_208;
  size_t local_200;
  t_ErrorsAndWarningsVector *local_1f8;
  vector<char,std::allocator<char>> *local_1f0;
  undefined1 local_1e8 [112];
  _Alloc_hider local_178;
  char *local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  _Alloc_hider local_158;
  char *local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148 [13];
  iterator local_70;
  iterator local_50;
  
  lVar27 = (long)length;
  local_230 = tick;
  local_218 = ofs;
  local_200 = tick_len;
  if (0 < length) {
    pcVar21 = data;
    do {
      pcVar20 = (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
                super__Deque_impl_data._M_finish._M_cur;
      if (pcVar20 ==
          (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
          _M_finish._M_last + -1) {
        std::deque<char,std::allocator<char>>::_M_push_back_aux<char_const&>
                  ((deque<char,std::allocator<char>> *)queue,pcVar21);
      }
      else {
        *pcVar20 = *pcVar21;
        piVar1 = &(queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
                  super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      pcVar21 = pcVar21 + 1;
    } while (pcVar21 < data + lVar27);
  }
  this->BuildOutputLogSize = this->BuildOutputLogSize + lVar27;
  local_1f0 = (vector<char,std::allocator<char>> *)&this->CurrentProcessingLine;
  local_238 = (deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->PreContext;
  local_1f8 = &this->ErrorsAndWarnings;
  local_21c = length;
  local_210 = lVar27;
  local_208 = data;
  do {
    this_00 = local_1f0;
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
             _M_start._M_cur;
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
             _M_start._M_first;
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
             _M_start._M_last;
    ppbVar7 = (_Map_pointer)
              (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data
              ._M_start._M_node;
    pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
             _M_finish._M_cur;
    bVar29 = pbVar4 == pbVar8;
    pbVar22 = pbVar5;
    pbVar24 = pbVar4;
    pbVar26 = pbVar6;
    ppbVar17 = ppbVar7;
    if (!bVar29) {
      cVar3 = *(char *)&(pbVar4->_M_dataplus)._M_p;
      while (cVar3 != '\n') {
        pbVar24 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)&(pbVar24->_M_dataplus)._M_p + 1);
        if (pbVar24 == pbVar26) {
          pbVar22 = ppbVar17[1];
          ppbVar17 = ppbVar17 + 1;
          pbVar26 = pbVar22 + 0x10;
          pbVar24 = pbVar22;
        }
        bVar29 = pbVar24 == pbVar8;
        if (bVar29) break;
        cVar3 = *(char *)&(pbVar24->_M_dataplus)._M_p;
      }
    }
    if (this->MaxWarnings <= this->TotalWarnings) {
      this->WarningQuotaReached = true;
    }
    if (this->MaxErrors <= this->TotalErrors) {
      this->ErrorQuotaReached = true;
    }
    if (bVar29) break;
    pcVar9 = (this->CurrentProcessingLine).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->CurrentProcessingLine).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish != pcVar9) {
      (this->CurrentProcessingLine).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar9;
    }
    local_258._0_8_ = pbVar24;
    local_258._8_8_ = pbVar22;
    local_258._16_8_ = pbVar26;
    local_240 = ppbVar17;
    local_1e8._0_8_ = pbVar4;
    local_1e8._8_8_ = pbVar5;
    local_1e8._16_8_ = pbVar6;
    local_1e8._24_8_ = ppbVar7;
    std::vector<char,std::allocator<char>>::_M_range_insert<std::_Deque_iterator<char,char&,char*>>
              (local_1f0,
               (this->CurrentProcessingLine).super__Vector_base<char,_std::allocator<char>_>._M_impl
               .super__Vector_impl_data._M_finish,local_1e8,local_258);
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    __position._M_current =
         (this->CurrentProcessingLine).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->CurrentProcessingLine).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                ((vector<char,_std::allocator<char>_> *)this_00,__position,local_1e8);
    }
    else {
      *__position._M_current = '\0';
      ppcVar2 = &(this->CurrentProcessingLine).super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppcVar2 = *ppcVar2 + 1;
    }
    local_228 = (this->CurrentProcessingLine).super__Vector_base<char,_std::allocator<char>_>.
                _M_impl.super__Vector_impl_data._M_start;
    iVar15 = ProcessSingleLine(this,local_228);
    local_1e8._0_8_ =
         (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
         _M_start._M_cur;
    local_1e8._24_8_ =
         (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
         _M_start._M_node;
    uVar18 = ((long)pbVar24 - (long)pbVar22) + 1;
    if (uVar18 < 0x200) {
      local_258._0_8_ = (long)&(pbVar24->_M_dataplus)._M_p + 1;
    }
    else {
      uVar25 = (uVar18 >> 9) + 0xff80000000000000;
      if (-1 < (long)pbVar24 - (long)pbVar22) {
        uVar25 = uVar18 >> 9;
      }
      ppbVar17 = ppbVar17 + uVar25;
      local_258._0_8_ = uVar18 + uVar25 * -0x200 + (long)*ppbVar17;
    }
    local_1e8._8_8_ = *(undefined8 *)local_1e8._24_8_;
    local_1e8._16_8_ = local_1e8._8_8_ + 0x200;
    local_258._8_8_ = *ppbVar17;
    local_258._16_8_ = local_258._8_8_ + 0x200;
    local_240 = ppbVar17;
    std::deque<char,_std::allocator<char>_>::_M_erase
              ((iterator *)&local_70,queue,(iterator *)local_1e8,(iterator *)local_258);
    pcVar21 = local_228;
    local_1e8._8_8_ = local_1e8 + 0x18;
    local_1e8._16_8_ = (_Elt_pointer)0x0;
    local_1e8._24_8_ = local_1e8._24_8_ & 0xffffffffffffff00;
    local_1e8._40_8_ = local_1e8 + 0x38;
    local_1e8._48_8_ = 0;
    local_1e8[0x38] = '\0';
    local_1e8._72_8_ = local_1e8 + 0x58;
    local_1e8._80_8_ = 0;
    local_1e8[0x58] = '\0';
    local_178._M_p = (pointer)&local_168;
    local_170 = (char *)0x0;
    local_168._M_local_buf[0] = '\0';
    local_158._M_p = (pointer)local_148;
    local_150 = (char *)0x0;
    local_148[0]._M_local_buf[0] = '\0';
    if (iVar15 == 2) {
      this->LastTickChar = '!';
      local_1e8[0] = 1;
      this->TotalErrors = this->TotalErrors + 1;
LAB_0026c80e:
      local_1e8._4_4_ = (int)this->OutputLineCounter + 1;
      strlen(local_228);
      std::__cxx11::string::_M_replace((ulong)(local_1e8 + 8),0,(char *)0x0,(ulong)pcVar21);
      std::__cxx11::string::_M_replace((ulong)&local_178,0,local_170,0x5e5069);
      std::__cxx11::string::_M_replace((ulong)&local_158,0,local_150,0x5e5069);
      pbVar23 = (this->PreContext).
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (pbVar23 !=
          (this->PreContext).
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
        pbVar28 = (this->PreContext).
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last;
        ppbVar17 = (this->PreContext).
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        do {
          pcVar10 = (pbVar23->_M_dataplus)._M_p;
          local_258._0_8_ = (_Elt_pointer)(local_258 + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_258,pcVar10,pcVar10 + pbVar23->_M_string_length);
          std::__cxx11::string::append((char *)local_258);
          std::__cxx11::string::_M_append((char *)&local_178,local_258._0_8_);
          if ((_Elt_pointer)local_258._0_8_ != (_Elt_pointer)(local_258 + 0x10)) {
            operator_delete((void *)local_258._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_258._16_8_)->_M_p + 1));
          }
          pbVar23 = pbVar23 + 1;
          if (pbVar23 == pbVar28) {
            pbVar23 = ppbVar17[1];
            ppbVar17 = ppbVar17 + 1;
            pbVar28 = pbVar23 + 0x10;
          }
        } while (pbVar23 !=
                 (this->PreContext).
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur);
      }
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_238);
      std::
      vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
      ::push_back(local_1f8,(value_type *)local_1e8);
      (this->LastErrorOrWarning)._M_current =
           (this->ErrorsAndWarnings).
           super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
      this->PostContextCount = 0;
    }
    else {
      pbVar23 = (_Elt_pointer)(local_258 + 0x10);
      if (iVar15 == 1) {
        this->LastTickChar = '*';
        local_1e8._0_4_ = SUB84(local_1e8._0_8_,1) << 8;
        this->TotalWarnings = this->TotalWarnings + 1;
        goto LAB_0026c80e;
      }
      pcVar11 = (this->ErrorsAndWarnings).
                super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((((this->ErrorsAndWarnings).
            super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
            ._M_impl.super__Vector_impl_data._M_start == pcVar11) ||
          (pcVar12 = (this->LastErrorOrWarning)._M_current, pcVar12 == pcVar11)) ||
         (this->MaxPostContext <= this->PostContextCount)) {
        local_258._0_8_ = pbVar23;
        if (local_228 == (char *)0x0) {
          pcVar20 = &DAT_00000001;
        }
        else {
          sVar16 = strlen(local_228);
          pcVar20 = pcVar21 + sVar16;
        }
        std::__cxx11::string::_M_construct<char_const*>((string *)local_258,pcVar21,pcVar20);
        std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258);
        if ((_Elt_pointer)local_258._0_8_ != pbVar23) {
          operator_delete((void *)local_258._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_258._16_8_)->_M_p + 1));
        }
        ppbVar17 = (this->PreContext).
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node;
        ppbVar7 = (this->PreContext).
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
        pbVar23 = (this->PreContext).
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        lVar27 = (long)pbVar23 -
                 (long)(this->PreContext).
                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_first >> 5;
        uVar18 = this->MaxPreContext;
        pbVar28 = (this->PreContext).
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur;
        if (uVar18 < ((long)(this->PreContext).
                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pbVar28 >> 5) +
                     lVar27 + ((((ulong)((long)ppbVar17 - (long)ppbVar7) >> 3) - 1) +
                              (ulong)(ppbVar17 == (_Map_pointer)0x0)) * 0x10) {
          uVar25 = lVar27 - uVar18;
          if (uVar25 < 0x10) {
            local_70._M_cur = pbVar23 + -uVar18;
          }
          else {
            uVar18 = (uVar25 >> 4) + 0xf000000000000000;
            if (0 < (long)uVar25) {
              uVar18 = uVar25 >> 4;
            }
            ppbVar17 = ppbVar17 + uVar18;
            local_70._M_cur = *ppbVar17 + uVar25 + uVar18 * -0x10;
          }
          local_258._8_8_ = *ppbVar7;
          local_258._16_8_ = local_258._8_8_ + 0x200;
          local_70._M_first = *ppbVar17;
          local_70._M_last = local_70._M_first + 0x10;
          local_258._0_8_ = pbVar28;
          local_240 = ppbVar7;
          local_70._M_node = ppbVar17;
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase(&local_50,
                     (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_238,(iterator *)local_258,&local_70);
        }
      }
      else {
        this->PostContextCount = this->PostContextCount + 1;
        std::__cxx11::string::append((char *)&pcVar12->PostContext);
        if (this->PostContextCount < this->MaxPostContext) {
          std::__cxx11::string::append
                    ((char *)&((this->LastErrorOrWarning)._M_current)->PostContext);
        }
      }
    }
    this->OutputLineCounter = this->OutputLineCounter + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_p != local_148) {
      operator_delete(local_158._M_p,
                      CONCAT71(local_148[0]._M_allocated_capacity._1_7_,local_148[0]._M_local_buf[0]
                              ) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_p != &local_168) {
      operator_delete(local_178._M_p,
                      CONCAT71(local_168._M_allocated_capacity._1_7_,local_168._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_1e8._72_8_ != local_1e8 + 0x58) {
      operator_delete((void *)local_1e8._72_8_,CONCAT71(local_1e8._89_7_,local_1e8[0x58]) + 1);
    }
    if ((undefined1 *)local_1e8._40_8_ != local_1e8 + 0x38) {
      operator_delete((void *)local_1e8._40_8_,CONCAT71(local_1e8._57_7_,local_1e8[0x38]) + 1);
    }
    if ((undefined1 *)local_1e8._8_8_ != local_1e8 + 0x18) {
      operator_delete((void *)local_1e8._8_8_,local_1e8._24_8_ + 1);
    }
  } while (!bVar29);
  sVar14 = local_200;
  uVar18 = *local_230;
  if (uVar18 * local_200 < this->BuildOutputLogSize) {
    do {
      *local_230 = uVar18 + 1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
      local_258[0] = this->LastTickChar;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,local_258,1);
      pcVar13 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar13,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x49b,(char *)local_258._0_8_,(this->super_cmCTestGenericHandler).Quiet);
      if ((_Elt_pointer)local_258._0_8_ != (_Elt_pointer)(local_258 + 0x10)) {
        operator_delete((void *)local_258._0_8_,
                        (ulong)((long)&((_Alloc_hider *)local_258._16_8_)->_M_p + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
      std::ios_base::~ios_base((ios_base *)&local_178);
      uVar18 = *local_230;
      if ((uVar18 != 0) && (uVar18 == (uVar18 / 0x32) * 0x32)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"  Size: ",8);
        poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,"K",1);
        std::ios::widen((char)poVar19->_vptr_basic_ostream[-3] + (char)poVar19);
        std::ostream::put((char)poVar19);
        poVar19 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,"    ",4);
        pcVar13 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar13,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x4a1,(char *)local_258._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        if ((_Elt_pointer)local_258._0_8_ != (_Elt_pointer)(local_258 + 0x10)) {
          operator_delete((void *)local_258._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_258._16_8_)->_M_p + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
        std::ios_base::~ios_base((ios_base *)&local_178);
      }
      uVar18 = *local_230;
    } while (uVar18 * sVar14 < this->BuildOutputLogSize);
    this->LastTickChar = '.';
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
  pcVar21 = local_208;
  iVar15 = local_21c;
  if (local_21c != 0) {
    std::ostream::write(local_1e8,(long)local_208);
    std::ostream::flush();
  }
  pcVar13 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar13,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x4ab,(char *)local_258._0_8_,false);
  if ((_Elt_pointer)local_258._0_8_ != (_Elt_pointer)(local_258 + 0x10)) {
    operator_delete((void *)local_258._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_258._16_8_)->_M_p + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
  std::ios_base::~ios_base((ios_base *)&local_178);
  if (iVar15 != 0) {
    std::ostream::write((char *)local_218,(long)pcVar21);
    std::ostream::flush();
  }
  return;
}

Assistant:

void cmCTestBuildHandler::ProcessBuffer(const char* data, int length,
  size_t& tick, size_t tick_len, std::ostream& ofs,
  t_BuildProcessingQueueType* queue)
{
  const std::string::size_type tick_line_len = 50;
  const char* ptr;
  for ( ptr = data; ptr < data+length; ptr ++ )
    {
    queue->push_back(*ptr);
    }
  this->BuildOutputLogSize += length;

  // until there are any lines left in the buffer
  while ( 1 )
    {
    // Find the end of line
    t_BuildProcessingQueueType::iterator it;
    for ( it = queue->begin();
      it != queue->end();
      ++ it )
      {
      if ( *it == '\n' )
        {
        break;
        }
      }

    // Once certain number of errors or warnings reached, ignore future errors
    // or warnings.
    if ( this->TotalWarnings >= this->MaxWarnings )
      {
      this->WarningQuotaReached = true;
      }
    if ( this->TotalErrors >= this->MaxErrors )
      {
      this->ErrorQuotaReached = true;
      }

    // If the end of line was found
    if ( it != queue->end() )
      {
      // Create a contiguous array for the line
      this->CurrentProcessingLine.clear();
      this->CurrentProcessingLine.insert(this->CurrentProcessingLine.end(),
                                         queue->begin(), it);
      this->CurrentProcessingLine.push_back(0);
      const char* line = &*this->CurrentProcessingLine.begin();

      // Process the line
      int lineType = this->ProcessSingleLine(line);

      // Erase the line from the queue
      queue->erase(queue->begin(), it+1);

      // Depending on the line type, produce error or warning, or nothing
      cmCTestBuildErrorWarning errorwarning;
      bool found = false;
      switch ( lineType )
        {
      case b_WARNING_LINE:
        this->LastTickChar = '*';
        errorwarning.Error = false;
        found = true;
        this->TotalWarnings ++;
        break;
      case b_ERROR_LINE:
        this->LastTickChar = '!';
        errorwarning.Error = true;
        found = true;
        this->TotalErrors ++;
        break;
        }
      if ( found )
        {
        // This is an error or warning, so generate report
        errorwarning.LogLine   = static_cast<int>(this->OutputLineCounter+1);
        errorwarning.Text        = line;
        errorwarning.PreContext  = "";
        errorwarning.PostContext = "";

        // Copy pre-context to report
        std::deque<std::string>::iterator pcit;
        for ( pcit = this->PreContext.begin();
          pcit != this->PreContext.end();
          ++pcit )
          {
          errorwarning.PreContext += *pcit + "\n";
          }
        this->PreContext.clear();

        // Store report
        this->ErrorsAndWarnings.push_back(errorwarning);
        this->LastErrorOrWarning = this->ErrorsAndWarnings.end()-1;
        this->PostContextCount = 0;
        }
      else
        {
        // This is not an error or warning.
        // So, figure out if this is a post-context line
        if ( !this->ErrorsAndWarnings.empty() &&
             this->LastErrorOrWarning != this->ErrorsAndWarnings.end() &&
             this->PostContextCount < this->MaxPostContext )
          {
          this->PostContextCount ++;
          this->LastErrorOrWarning->PostContext += line;
          if ( this->PostContextCount < this->MaxPostContext )
            {
            this->LastErrorOrWarning->PostContext += "\n";
            }
          }
        else
          {
          // Otherwise store pre-context for the next error
          this->PreContext.push_back(line);
          if ( this->PreContext.size() > this->MaxPreContext )
            {
            this->PreContext.erase(this->PreContext.begin(),
              this->PreContext.end()-this->MaxPreContext);
            }
          }
        }
      this->OutputLineCounter ++;
      }
    else
      {
      break;
      }
    }

  // Now that the buffer is processed, display missing ticks
  int tickDisplayed = false;
  while ( this->BuildOutputLogSize > (tick * tick_len) )
    {
    tick ++;
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, this->LastTickChar,
      this->Quiet);
    tickDisplayed = true;
    if ( tick % tick_line_len == 0 && tick > 0 )
      {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "  Size: "
        << ((this->BuildOutputLogSize + 512) / 1024) << "K" << std::endl
        << "    ", this->Quiet);
      }
    }
  if ( tickDisplayed )
    {
    this->LastTickChar = '.';
    }

  // And if this is verbose output, display the content of the chunk
  cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
    cmCTestLogWrite(data, length));

  // Always store the chunk to the file
  ofs << cmCTestLogWrite(data, length);
}